

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

int ecx_pki_priv_to_der(void *vecxkey,uchar **pder)

{
  uchar **in_RSI;
  long in_RDI;
  int keybloblen;
  ASN1_OCTET_STRING oct;
  ECX_KEY *ecxkey;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int in_stack_ffffffffffffffcc;
  uchar *in_stack_ffffffffffffffd0;
  uchar *file;
  int local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x50) == 0)) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                  (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ERR_set_error(0x39,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    file = *(uchar **)(in_RDI + 0x50);
    local_38 = (int)*(undefined8 *)(in_RDI + 0x58);
    local_4 = i2d_ASN1_OCTET_STRING((ASN1_OCTET_STRING *)&local_38,in_RSI);
    if (local_4 < 0) {
      ERR_new();
      ERR_set_debug((char *)file,in_stack_ffffffffffffffcc,
                    (char *)CONCAT44(local_4,in_stack_ffffffffffffffc0));
      ERR_set_error(0x39,0xc0100,(char *)0x0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int ecx_pki_priv_to_der(const void *vecxkey, unsigned char **pder)
{
    const ECX_KEY *ecxkey = vecxkey;
    ASN1_OCTET_STRING oct;
    int keybloblen;

    if (ecxkey == NULL || ecxkey->privkey == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    oct.data = ecxkey->privkey;
    oct.length = ecxkey->keylen;
    oct.flags = 0;

    keybloblen = i2d_ASN1_OCTET_STRING(&oct, pder);
    if (keybloblen < 0) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    return keybloblen;
}